

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeConstraintPS::execute
          (FreeConstraintPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  pointer pnVar6;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar13;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  slack;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar4 = this->m_i;
  iVar5 = this->m_old_i;
  if (iVar4 != iVar5) {
    pnVar6 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar6[iVar5].m_backend.data + 0x20) =
         *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
    uVar8 = *(undefined8 *)&pnVar6[iVar4].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar3 = (uint *)((long)&pnVar6[iVar5].m_backend.data + 0x10);
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar6[iVar5].m_backend.data = uVar8;
    *(undefined8 *)((long)&pnVar6[iVar5].m_backend.data + 8) = uVar9;
    pnVar6[iVar5].m_backend.exp = pnVar6[iVar4].m_backend.exp;
    pnVar6[iVar5].m_backend.neg = pnVar6[iVar4].m_backend.neg;
    iVar11 = pnVar6[iVar4].m_backend.prec_elem;
    pnVar6[iVar5].m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
    pnVar6[iVar5].m_backend.prec_elem = iVar11;
    iVar4 = this->m_i;
    pnVar6 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar5 = this->m_old_i;
    *(undefined8 *)((long)&pnVar6[iVar5].m_backend.data + 0x20) =
         *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 0x20);
    uVar8 = *(undefined8 *)&pnVar6[iVar4].m_backend.data;
    uVar9 = *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 8);
    puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
    uVar10 = *(undefined8 *)(puVar2 + 2);
    puVar3 = (uint *)((long)&pnVar6[iVar5].m_backend.data + 0x10);
    *(undefined8 *)puVar3 = *(undefined8 *)puVar2;
    *(undefined8 *)(puVar3 + 2) = uVar10;
    *(undefined8 *)&pnVar6[iVar5].m_backend.data = uVar8;
    *(undefined8 *)((long)&pnVar6[iVar5].m_backend.data + 8) = uVar9;
    pnVar6[iVar5].m_backend.exp = pnVar6[iVar4].m_backend.exp;
    pnVar6[iVar5].m_backend.neg = pnVar6[iVar4].m_backend.neg;
    iVar11 = pnVar6[iVar4].m_backend.prec_elem;
    pnVar6[iVar5].m_backend.fpclass = pnVar6[iVar4].m_backend.fpclass;
    pnVar6[iVar5].m_backend.prec_elem = iVar11;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  local_68.fpclass = cpp_dec_float_finite;
  local_68.prec_elem = 10;
  local_68.data._M_elems[0] = 0;
  local_68.data._M_elems[1] = 0;
  local_68.data._M_elems[2] = 0;
  local_68.data._M_elems[3] = 0;
  local_68.data._M_elems[4] = 0;
  local_68.data._M_elems[5] = 0;
  local_68.data._M_elems._24_5_ = 0;
  local_68.data._M_elems[7]._1_3_ = 0;
  local_68.data._M_elems._32_5_ = 0;
  local_68.data._M_elems[9]._1_3_ = 0;
  local_68.exp = 0;
  local_68.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar14 = 0;
    lVar13 = 0;
    do {
      pNVar7 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pcVar1 = (cpp_dec_float<50U,_int,_void> *)
               ((long)(pNVar7->val).m_backend.data._M_elems + lVar14);
      pcVar12 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start
                 [*(int *)((long)(&pNVar7->val + 1) + lVar14)].m_backend;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      v = pcVar1;
      if ((&local_a8 != pcVar12) && (v = pcVar12, pcVar1 != &local_a8)) {
        uVar8 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
        local_a8.data._M_elems._32_5_ = SUB85(uVar8,0);
        local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
        uVar8 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
        local_a8.data._M_elems._24_5_ = SUB85(uVar8,0);
        local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar8 >> 0x28);
        local_a8.exp = *(int *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar14);
        local_a8.neg = *(bool *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar14 + 4);
        local_a8._48_8_ = *(undefined8 *)((long)(&(pNVar7->val).m_backend.data + 1) + lVar14 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&local_68,&local_a8);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x3c;
    } while (lVar13 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  iVar4 = this->m_i;
  pnVar6 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)&pnVar6[iVar4].m_backend.data + 0x20) =
       CONCAT35(local_68.data._M_elems[9]._1_3_,local_68.data._M_elems._32_5_);
  puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
  *(undefined8 *)puVar2 = local_68.data._M_elems._16_8_;
  *(ulong *)(puVar2 + 2) = CONCAT35(local_68.data._M_elems[7]._1_3_,local_68.data._M_elems._24_5_);
  *(undefined8 *)&pnVar6[iVar4].m_backend.data = local_68.data._M_elems._0_8_;
  *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 8) = local_68.data._M_elems._8_8_;
  pnVar6[iVar4].m_backend.exp = local_68.exp;
  pnVar6[iVar4].m_backend.neg = local_68.neg;
  pnVar6[iVar4].m_backend.fpclass = local_68.fpclass;
  pnVar6[iVar4].m_backend.prec_elem = local_68.prec_elem;
  iVar4 = this->m_i;
  pnVar6 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 0x20) =
       *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
  uVar8 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
  uVar9 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
  uVar10 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
  puVar2 = (uint *)((long)&pnVar6[iVar4].m_backend.data + 0x10);
  *(undefined8 *)puVar2 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
  *(undefined8 *)(puVar2 + 2) = uVar10;
  *(undefined8 *)&pnVar6[iVar4].m_backend.data = uVar8;
  *(undefined8 *)((long)&pnVar6[iVar4].m_backend.data + 8) = uVar9;
  pnVar6[iVar4].m_backend.exp = (this->m_row_obj).m_backend.exp;
  pnVar6[iVar4].m_backend.neg = (this->m_row_obj).m_backend.neg;
  iVar11 = (this->m_row_obj).m_backend.prec_elem;
  pnVar6[iVar4].m_backend.fpclass = (this->m_row_obj).m_backend.fpclass;
  pnVar6[iVar4].m_backend.prec_elem = iVar11;
  rStatus->data[this->m_i] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::FreeConstraintPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   R slack = 0.0;

   for(int k = 0; k < m_row.size(); ++k)
      slack += m_row.value(k) * x[m_row.index(k)];

   s[m_i] = slack;

   // dual:
   y[m_i] = m_row_obj;

   // basis:
   rStatus[m_i] = SPxSolverBase<R>::BASIC;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM15 Dimension doesn't match after this step.");
   }

#endif
}